

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O3

error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>
* __thiscall
pstore::http::details::
read_and_byte_swap<unsigned_short,pstore::http::buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or_n<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>,_unsigned_short>
           *__return_storage_ptr__,details *this,
          buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
          *reader,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io)

{
  unsigned_short v;
  anon_class_1_0_00000001 local_43;
  element_type_conflict local_42;
  error_or_n<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&,_gsl::span<typename_span<unsigned_short,__1L>::element_type>_>
  local_40;
  span<unsigned_short,__1L> local_20;
  
  local_20.storage_.data_ = &local_42;
  local_42 = 0;
  local_20.storage_.super_extent_type<_1L>.size_ = 1;
  buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::get_span<pstore::gsl::span<unsigned_short,_1l>>
            (&local_40,
             (buffered_reader<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::error_or<std::pair<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char,_1l>const&)>
              *)this,(descriptor<pstore::details::posix_descriptor_traits> *)reader,&local_20);
  pstore::operator>>=(__return_storage_ptr__,&local_40,&local_43);
  if (local_40.has_error_ == false) {
    error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_short,-1l>>>
    ::
    value_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_short,_1l>>>&,std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_short,_1l>>>
              (&local_40);
  }
  else {
    error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_short,-1l>>>
    ::
    error_storage_impl<pstore::error_or<std::tuple<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_short,_1l>>>&,std::error_code>
              (&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

error_or_n<IO, T> read_and_byte_swap (Reader & reader, IO io) {
                auto v = T{0};
                return reader.get_span (io, gsl::make_span (&v, 1)) >>=
                       [] (IO io2, gsl::span<T> const & l1) {
                           return error_or_n<IO, T>{in_place, io2, network_to_host (l1.at (0))};
                       };
            }